

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double find_split_dens_longform<double,double>
                 (double *x,size_t *ix_arr,size_t st,size_t end,double *split_point,size_t *split_ix
                 )

{
  long lVar1;
  double dVar2;
  double dVar3;
  double y;
  undefined1 auVar4 [16];
  long lVar5;
  size_t sVar6;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_98;
  ulong uVar7;
  
  dVar2 = x[ix_arr[st]];
  dVar3 = x[ix_arr[end]];
  lVar5 = (end - st) + 1;
  auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar9._0_8_ = lVar5;
  auVar9._12_4_ = 0x45300000;
  dVar10 = dVar3 - dVar2;
  local_98 = -INFINITY;
  sVar6 = st;
  y = dVar2;
  while (dVar8 = y, uVar7 = sVar6, sVar6 = uVar7 + 1, uVar7 < end) {
    y = x[ix_arr[sVar6]];
    if ((dVar8 != y) || (NAN(dVar8) || NAN(y))) {
      dVar8 = midpoint<double>(dVar8,y);
      auVar14._0_8_ = dVar8 - dVar2;
      auVar14._8_8_ = dVar3 - dVar8;
      if (((auVar14._0_8_ != 0.0) || (NAN(auVar14._0_8_))) &&
         ((auVar14._8_8_ != 0.0 || (NAN(auVar14._8_8_))))) {
        lVar1 = sVar6 - st;
        auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar11._0_8_ = lVar1;
        auVar11._12_4_ = 0x45300000;
        auVar14 = maxpd(auVar14,_DAT_00325220);
        auVar4._8_8_ = dVar10;
        auVar4._0_8_ = dVar10;
        auVar14 = divpd(auVar14,auVar4);
        dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
        auVar13._0_8_ = dVar12 * dVar12;
        auVar13._8_8_ = (1.0 - dVar12) * (1.0 - dVar12);
        auVar14 = divpd(auVar13,auVar14);
        dVar12 = auVar14._8_8_ + auVar14._0_8_;
        if ((!NAN(dVar12)) && ((ABS(dVar12) != INFINITY && (local_98 < dVar12)))) {
          *split_point = dVar8;
          *split_ix = uVar7;
          local_98 = dVar12;
        }
      }
    }
  }
  return local_98;
}

Assistant:

double find_split_dens_longform(real_t *restrict x, size_t *restrict ix_arr, size_t st, size_t end,
                                double &restrict split_point, size_t &restrict split_ix)
{
    double best_gain = -HUGE_VAL;
    real_t xmin = x[ix_arr[st]];
    real_t xmax = x[ix_arr[end]];
    real_t xleft, xright;
    real_t xmid;
    ldouble_safe pct_left, pct_right;
    ldouble_safe rpct_left, rpct_right;
    ldouble_safe n_tot = end - st + 1;
    ldouble_safe xtot = (ldouble_safe)xmax - (ldouble_safe)xmin;
    ldouble_safe cnt_left;
    double this_gain;

    for (size_t row = st; row < end; row++)
    {
        if (x[ix_arr[row]] == x[ix_arr[row+1]]) continue;
        xmid = midpoint(x[ix_arr[row]], x[ix_arr[row+1]]);
        xleft = xmid - xmin;
        xright = xmax - xmid;
        if (unlikely(!xleft || !xright)) continue;

        cnt_left = (ldouble_safe)(row-st+1);

        xleft = std::fmax(xleft, (real_t)std::numeric_limits<real_t>::min());
        xright = std::fmax(xright, (real_t)std::numeric_limits<real_t>::min());
        pct_left = cnt_left / n_tot;
        pct_right = (ldouble_safe)1 - pct_left;
        rpct_left = (ldouble_safe)xleft / xtot;
        rpct_right = (ldouble_safe)xright / xtot;

        this_gain = square(pct_left) / rpct_left + square(pct_right) / rpct_right;
        if (unlikely(is_na_or_inf(this_gain))) continue;
        if (this_gain > best_gain)
        {
            best_gain = this_gain;
            split_point = xmid;
            split_ix = row;
        }
    }

    return best_gain;
}